

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

void __thiscall Problem_CGBG_FF::~Problem_CGBG_FF(Problem_CGBG_FF *this)

{
  (this->super_BayesianGameCollaborativeGraphical).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__Problem_CGBG_FF_005df090;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->_m_agentPositionY).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->_m_agentPositionX).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->_m_housePositionY).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->_m_housePositionX).super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_houseIndices_action);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_houseIndices_obs);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_agentsForHouse_obs);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_agentsForHouse_action);
  std::
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
  ::~_Rb_tree(&(this->_m_Norm_cache)._M_t);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&this->_m_allAgents);
  BayesianGameCollaborativeGraphical::~BayesianGameCollaborativeGraphical
            (&this->super_BayesianGameCollaborativeGraphical);
  return;
}

Assistant:

Problem_CGBG_FF::~Problem_CGBG_FF()
{
}